

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

void pybind11::detail::clear_patients(PyObject *self)

{
  const_iterator __it;
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  long *plVar4;
  internals *piVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  iterator __end2;
  __hash_code __code;
  undefined8 *puVar8;
  
  piVar5 = get_internals();
  p_Var6 = (piVar5->patients)._M_h._M_buckets[(ulong)self % (piVar5->patients)._M_h._M_bucket_count]
  ;
  for (p_Var7 = p_Var6->_M_nxt; (PyObject *)p_Var7[1]._M_nxt != self; p_Var7 = p_Var7->_M_nxt) {
    p_Var6 = p_Var7;
  }
  __it.
  super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
             )p_Var6->_M_nxt;
  puVar1 = *(undefined8 **)
            ((long)__it.
                   super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                   ._M_cur + 0x10);
  puVar2 = *(undefined8 **)
            ((long)__it.
                   super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                   ._M_cur + 0x18);
  lVar3 = *(long *)((long)__it.
                          super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                          ._M_cur + 0x20);
  *(undefined8 *)
   ((long)__it.
          super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
          ._M_cur + 0x10) = 0;
  *(undefined8 *)
   ((long)__it.
          super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
          ._M_cur + 0x18) = 0;
  *(undefined8 *)
   ((long)__it.
          super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
          ._M_cur + 0x20) = 0;
  std::
  _Hashtable<const__object_*,_std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const__object_*>,_std::hash<const__object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(piVar5->patients)._M_h,__it);
  *(byte *)&self[3].ob_refcnt = (byte)self[3].ob_refcnt & 0xef;
  for (puVar8 = puVar1; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    plVar4 = (long *)*puVar8;
    if (plVar4 != (long *)0x0) {
      *puVar8 = 0;
      *plVar4 = *plVar4 + -1;
      if (*plVar4 == 0) {
        _Py_Dealloc();
      }
    }
  }
  if (puVar1 != (undefined8 *)0x0) {
    operator_delete(puVar1,lVar3 - (long)puVar1);
    return;
  }
  return;
}

Assistant:

inline void clear_patients(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);
    auto &internals = get_internals();
    auto pos = internals.patients.find(self);
    assert(pos != internals.patients.end());
    // Clearing the patients can cause more Python code to run, which
    // can invalidate the iterator. Extract the vector of patients
    // from the unordered_map first.
    auto patients = std::move(pos->second);
    internals.patients.erase(pos);
    instance->has_patients = false;
    for (PyObject *&patient : patients)
        Py_CLEAR(patient);
}